

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

void xray_re::xr_mesh_builder::create_unique_array<xray_re::_vector3<float>>
               (b_proxy_vec *refs,
               vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *data,
               _vector3<float> *raw_data,uint32_t *mapping)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  pointer pbVar5;
  __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
  *__lhs;
  bool local_79;
  _vector3<float> *value;
  b_proxy_vec_it end;
  b_proxy_vec_it it;
  less<xray_re::_vector3<float>_> lStack_40;
  uint32_t index;
  __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
  local_38;
  __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
  local_30;
  uint32_t *local_28;
  uint32_t *mapping_local;
  _vector3<float> *raw_data_local;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *data_local;
  b_proxy_vec *refs_local;
  
  local_28 = mapping;
  mapping_local = (uint32_t *)raw_data;
  raw_data_local = (_vector3<float> *)data;
  data_local = (vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *)refs;
  local_30._M_current =
       (b_proxy *)
       std::
       vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
       ::begin(refs);
  local_38._M_current =
       (b_proxy *)
       std::
       vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
       ::end((vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
              *)data_local);
  b_proxy::less<xray_re::_vector3<float>_>::less
            (&stack0xffffffffffffffc0,(_vector3<float> *)mapping_local);
  std::
  sort<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_proxy*,std::vector<xray_re::xr_mesh_builder::b_proxy,std::allocator<xray_re::xr_mesh_builder::b_proxy>>>,xray_re::xr_mesh_builder::b_proxy::less<xray_re::_vector3<float>>>
            (local_30,local_38,lStack_40);
  it._M_current._4_4_ = 0;
  end._M_current =
       (b_proxy *)
       std::
       vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
       ::begin((vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
                *)data_local);
  value = (_vector3<float> *)
          std::
          vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
          ::end((vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>
                 *)data_local);
  while (bVar4 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
                                  *)&value), puVar3 = mapping_local, bVar4) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
             ::operator->(&end);
    uVar1 = pbVar5->index;
    std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::push_back
              ((vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *)
               raw_data_local,(value_type *)(puVar3 + (ulong)uVar1 * 3));
    puVar2 = local_28;
    pbVar5 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
             ::operator->(&end);
    puVar2[pbVar5->index] = it._M_current._4_4_;
    while( true ) {
      __lhs = __gnu_cxx::
              __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
              ::operator++(&end);
      bVar4 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
                                *)&value);
      puVar2 = mapping_local;
      local_79 = false;
      if (bVar4) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
                 ::operator->(&end);
        local_79 = _vector3<float>::operator==
                             ((_vector3<float> *)(puVar2 + (ulong)pbVar5->index * 3),
                              (value_type *)(puVar3 + (ulong)uVar1 * 3));
      }
      puVar2 = local_28;
      if (local_79 == false) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_proxy_*,_std::vector<xray_re::xr_mesh_builder::b_proxy,_std::allocator<xray_re::xr_mesh_builder::b_proxy>_>_>
               ::operator->(&end);
      puVar2[pbVar5->index] = it._M_current._4_4_;
    }
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

void
xr_mesh_builder::create_unique_array(b_proxy_vec& refs, std::vector<T>& data, const T* raw_data, uint32_t* mapping)
{
	std::sort(refs.begin(), refs.end(), b_proxy::less<T>(raw_data));
	uint32_t index = 0;
	for (b_proxy_vec_it it = refs.begin(), end = refs.end(); it != end; ++index) {
		const T& value = raw_data[it->index];
		data.push_back(value);
		mapping[it->index] = index;
		while (++it != end && raw_data[it->index] == value)
			mapping[it->index] = index;
	}
}